

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

void __thiscall Am_Value_List::~Am_Value_List(Am_Value_List *this)

{
  Am_Value_List_Data *pAVar1;
  uint uVar2;
  
  pAVar1 = this->data;
  if (pAVar1 != (Am_Value_List_Data *)0x0) {
    uVar2 = (pAVar1->super_Am_Wrapper).refs;
    if (uVar2 == 0) {
      Am_Error();
    }
    uVar2 = uVar2 - 1;
    (pAVar1->super_Am_Wrapper).refs = uVar2;
    if (uVar2 == 0) {
      (*(pAVar1->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
    }
  }
  this->data = (Am_Value_List_Data *)0x0;
  this->item = (Am_List_Item *)0x0;
  return;
}

Assistant:

Am_Value_List::~Am_Value_List()
{
  if (data) {
    if (data->Is_Zero())
      Am_Error();
    data->Release();
  }
  data = nullptr;
  item = nullptr;
}